

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

int cpu_breakpoint_remove_riscv32(CPUState_conflict *cpu,vaddr pc,int flags)

{
  CPUBreakpoint *breakpoint;
  
  breakpoint = (cpu->breakpoints).tqh_first;
  while( true ) {
    if (breakpoint == (CPUBreakpoint *)0x0) {
      return -2;
    }
    if ((breakpoint->pc == pc) && (breakpoint->flags == flags)) break;
    breakpoint = (breakpoint->entry).tqe_next;
  }
  cpu_breakpoint_remove_by_ref_riscv32(cpu,breakpoint);
  return 0;
}

Assistant:

int cpu_breakpoint_remove(CPUState *cpu, vaddr pc, int flags)
{
    CPUBreakpoint *bp;

    QTAILQ_FOREACH(bp, &cpu->breakpoints, entry) {
        if (bp->pc == pc && bp->flags == flags) {
            cpu_breakpoint_remove_by_ref(cpu, bp);
            return 0;
        }
    }
    return -ENOENT;
}